

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

Vec_Ptr_t * Ver_ParseCollectUndefBoxes(Ver_Man_t *pMan)

{
  Abc_Ntk_t *pNtkBox_00;
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar3;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pBox;
  Abc_Ntk_t *pNtkBox;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vUndefs;
  Ver_Man_t *pMan_local;
  
  for (local_34 = 0; iVar1 = Vec_PtrSize(pMan->pDesign->vModules), local_34 < iVar1;
      local_34 = local_34 + 1) {
    pvVar2 = Vec_PtrEntry(pMan->pDesign->vModules,local_34);
    *(undefined8 *)((long)pvVar2 + 0x158) = 0;
  }
  p = Vec_PtrAlloc(0x10);
  for (local_34 = 0; iVar1 = Vec_PtrSize(pMan->pDesign->vModules), local_34 < iVar1;
      local_34 = local_34 + 1) {
    pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,local_34);
    for (local_38 = 0; iVar1 = Vec_PtrSize(pNtk_00->vBoxes), local_38 < iVar1;
        local_38 = local_38 + 1) {
      pObj = Abc_NtkBox(pNtk_00,local_38);
      iVar1 = Abc_ObjIsBlackbox(pObj);
      if (((iVar1 != 0) &&
          (pNtkBox_00 = (Abc_Ntk_t *)(pObj->field_5).pData, pNtkBox_00 != (Abc_Ntk_t *)0x0)) &&
         (iVar1 = Ver_NtkIsDefined(pNtkBox_00), iVar1 == 0)) {
        if (pNtkBox_00->pData == (void *)0x0) {
          Vec_PtrPush(p,pNtkBox_00);
          pVVar3 = Vec_PtrAlloc(0x10);
          pNtkBox_00->pData = pVVar3;
        }
        Vec_PtrPush((Vec_Ptr_t *)pNtkBox_00->pData,pObj);
      }
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t * Ver_ParseCollectUndefBoxes( Ver_Man_t * pMan )
{
    Vec_Ptr_t * vUndefs;
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pBox;
    int i, k;
    // clear the module structures
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->pData = NULL;
    // go through all the blackboxes
    vUndefs = Vec_PtrAlloc( 16 );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        Abc_NtkForEachBlackbox( pNtk, pBox, k )
        {
            pNtkBox = (Abc_Ntk_t *)pBox->pData;
            if ( pNtkBox == NULL )
                continue;
            if ( Ver_NtkIsDefined(pNtkBox) )
                continue;
            if ( pNtkBox->pData == NULL )
            {
                // save the box
                Vec_PtrPush( vUndefs, pNtkBox );
                pNtkBox->pData = Vec_PtrAlloc( 16 );
            }
            // save the instance
            Vec_PtrPush( (Vec_Ptr_t *)pNtkBox->pData, pBox );
        }
    }
    return vUndefs;
}